

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O2

size_t __thiscall wasm::DFA::anon_unknown_0::Partitions::Set::split(Set *this)

{
  Partitions *pPVar1;
  size_t sVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  pointer puVar6;
  size_t i;
  ulong uVar7;
  
  pPVar1 = this->partitions;
  sVar2 = this->index;
  puVar3 = (pPVar1->beginnings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = puVar3[sVar2];
  puVar4 = (pPVar1->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = puVar4[sVar2];
  if (uVar5 != uVar7) {
    puVar6 = (pPVar1->endings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar5 != puVar6[sVar2]) {
      sVar2 = pPVar1->sets;
      pPVar1->sets = sVar2 + 1;
      puVar3[sVar2] = uVar7;
      puVar4[sVar2] = uVar7;
      puVar6[sVar2] = uVar5;
      for (; uVar7 < uVar5; uVar7 = uVar7 + 1) {
        (pPVar1->setIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start
        [(pPVar1->elements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar7]] = sVar2;
      }
      puVar3[this->index] = uVar5;
      return sVar2;
    }
    puVar4[sVar2] = uVar7;
  }
  return 0;
}

Assistant:

size_t split() {
      size_t begin = partitions.beginnings[index];
      size_t end = partitions.endings[index];
      size_t pivot = partitions.pivots[index];
      if (pivot == begin) {
        // No elements marked, so there is nothing to do.
        return 0;
      }
      if (pivot == end) {
        // All elements were marked, so just unmark them.
        partitions.pivots[index] = begin;
        return 0;
      }
      // Create a new set covering the marked region.
      size_t newIndex = partitions.sets++;
      partitions.beginnings[newIndex] = begin;
      partitions.pivots[newIndex] = begin;
      partitions.endings[newIndex] = pivot;
      for (size_t i = begin; i < pivot; ++i) {
        partitions.setIndices[partitions.elements[i]] = newIndex;
      }
      // Update the old set. The end and pivot are already correct.
      partitions.beginnings[index] = pivot;
      return newIndex;
    }